

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

void m_initthrow(monst *mtmp,int otyp,int oquan)

{
  int iVar1;
  uint uVar2;
  obj *obj;
  obj *otmp;
  int oquan_local;
  int otyp_local;
  monst *mtmp_local;
  
  obj = mksobj(mtmp->dlevel,otyp,'\x01','\0');
  iVar1 = rn2(oquan);
  obj->quan = iVar1 + 3;
  uVar2 = weight(obj);
  obj->owt = uVar2;
  if (otyp == 3) {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffff7fff | 0x8000;
  }
  mpickobj(mtmp,obj);
  return;
}

Assistant:

static void m_initthrow(struct monst *mtmp, int otyp, int oquan)
{
	struct obj *otmp;

	otmp = mksobj(mtmp->dlevel, otyp, TRUE, FALSE);
	otmp->quan = (long) rn1(oquan, 3);
	otmp->owt = weight(otmp);
	if (otyp == ORCISH_ARROW) otmp->opoisoned = TRUE;
	mpickobj(mtmp, otmp);
}